

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O2

void __thiscall YacclabTests::CheckAlgorithmsExistence(YacclabTests *this)

{
  pointer pbVar1;
  bool bVar2;
  pointer s;
  allocator local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar1 = (this->mode_cfg_->ccl_algorithms).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (s = (this->mode_cfg_->ccl_algorithms).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start; s != pbVar1; s = s + 1) {
    bVar2 = LabelingMapSingleton::Exists(s);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->mode_cfg_->ccl_existing_algorithms,s);
    }
    else {
      std::operator+(&local_70,"Unable to find the algorithm \'",s);
      std::operator+(&local_50,&local_70,"\'");
      std::__cxx11::string::string((string *)&local_90,"",&local_91);
      OutputBox::Cwarning(&this->ob_,&local_50,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return;
}

Assistant:

void YacclabTests::CheckAlgorithmsExistence() {
    for (auto& algo_name : mode_cfg_.ccl_algorithms) {
        if (!LabelingMapSingleton::Exists(algo_name)) {
            ob_.Cwarning("Unable to find the algorithm '" + algo_name + "'");
        }
        else {
            mode_cfg_.ccl_existing_algorithms.push_back(algo_name);
        }
    }
}